

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O3

ctmbstr tidyOptGetValue(TidyDoc tdoc,TidyOptionId optId)

{
  ctmbstr ptVar1;
  TidyDocImpl *impl;
  
  if (tdoc == (TidyDoc)0x0) {
    return (ctmbstr)0x0;
  }
  if (optId == TidyDoctype) {
    if (tdoc[0x38]._opaque == 5) {
      return *(ctmbstr *)(tdoc + 0x36);
    }
    ptVar1 = prvTidyGetPickListLabelForPick(TidyDoctypeMode,tdoc[0x38]._opaque);
    return ptVar1;
  }
  return *(ctmbstr *)(tdoc + (ulong)optId * 2 + 0x1c);
}

Assistant:

ctmbstr TIDY_CALL       tidyOptGetValue( TidyDoc tdoc, TidyOptionId optId )
{
    TidyDocImpl* impl = tidyDocToImpl( tdoc );
    ctmbstr optval = NULL;
    if ( impl )
    {
        if ( optId == TidyDoctype )
        {
            /* Special case for TidyDoctype, because it has a picklist and is a string. */
            uint pick = tidyOptGetInt( tdoc, TidyDoctypeMode );
            if ( pick != TidyDoctypeUser )
            {
                optval = TY_(GetPickListLabelForPick)( TidyDoctypeMode, pick );
            } else {
                optval = cfgStr( impl, optId );
            }
        } else {
            /* Standard case. */
            optval = cfgStr( impl, optId );
        }
    }
    return optval;
}